

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Statement * __thiscall Parser::simpStmt(Parser *this)

{
  int iVar1;
  ExprNode *id;
  AssignmentStatement *unaff_RBX;
  Token tok;
  Token op;
  Token local_f8;
  Token local_88;
  
  Tokenizer::getToken(&local_f8,this->tokenizer);
  Tokenizer::ungetToken(this->tokenizer);
  iVar1 = std::__cxx11::string::compare((char *)&local_f8);
  if (iVar1 == 0) {
    Tokenizer::ungetToken(this->tokenizer);
    unaff_RBX = (AssignmentStatement *)printStmt(this);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_f8);
    if (iVar1 == 0) {
      unaff_RBX = (AssignmentStatement *)returnStmt(this);
    }
    else if (local_f8._name._M_string_length == 0) {
      unaff_RBX = (AssignmentStatement *)0x0;
    }
    else {
      id = variableID(this);
      Tokenizer::getToken(&local_88,this->tokenizer);
      Tokenizer::ungetToken(this->tokenizer);
      if ((byte)local_88._symbol < 0x3d) {
        if (local_88._symbol == 0x28) {
          unaff_RBX = (AssignmentStatement *)callStmt(this,id);
        }
        else if (local_88._symbol == 0x2e) {
          unaff_RBX = (AssignmentStatement *)arrayOps(this,id);
        }
      }
      else if ((local_88._symbol == 0x5b) || (local_88._symbol == 0x3d)) {
        unaff_RBX = assignStmt(this,id);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._string._M_dataplus._M_p != &local_88._string.field_2) {
        operator_delete(local_88._string._M_dataplus._M_p,
                        local_88._string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._relOp._M_dataplus._M_p != &local_88._relOp.field_2) {
        operator_delete(local_88._relOp._M_dataplus._M_p,
                        local_88._relOp.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._name._M_dataplus._M_p != &local_88._name.field_2) {
        operator_delete(local_88._name._M_dataplus._M_p,
                        local_88._name.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._string._M_dataplus._M_p != &local_f8._string.field_2) {
    operator_delete(local_f8._string._M_dataplus._M_p,
                    local_f8._string.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._relOp._M_dataplus._M_p != &local_f8._relOp.field_2) {
    operator_delete(local_f8._relOp._M_dataplus._M_p,
                    local_f8._relOp.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._name._M_dataplus._M_p != &local_f8._name.field_2) {
    operator_delete(local_f8._name._M_dataplus._M_p,local_f8._name.field_2._M_allocated_capacity + 1
                   );
  }
  return (Statement *)unaff_RBX;
}

Assistant:

Statement *Parser::simpStmt() {
    // stimple_stmt: (print_stmt | assign_stmt | array_ops | call_stmt | return_stmt) NEWLINE

    Token tok = tokenizer.getToken();
    tokenizer.ungetToken();
    if (tok.isPrint()){
        tokenizer.ungetToken();
        PrintStatement *printStatement = printStmt();
        return printStatement;
    } else if (tok.isReturn()){
        ReturnStatement *returnStatement = returnStmt();
        return returnStatement;
    }else if(tok.isName()) {
        ExprNode *id = variableID();
        Token op = tokenizer.getToken();
        tokenizer.ungetToken();
        if(op.isAssignmentOperator() || op.isOpenBrace()) {
            AssignmentStatement *assignmentStatement = assignStmt(id);
            return assignmentStatement;
        } else if(op.isDot()){
            ArrayOps *arrayOperator = arrayOps(id);
            return arrayOperator;
        } else if(op.isOpenParen()){
            CallStatement *callStatement = callStmt(id);
            return callStatement;
        }

    } else return nullptr;


}